

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedBindingUpdate::Cleanup(AdvancedBindingUpdate *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_vbo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_ebo);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_fsp);
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_ppo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteVertexArrays(2, m_vao);
		glDeleteBuffers(2, m_vbo);
		glDeleteBuffers(2, m_ebo);
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		glDeleteProgramPipelines(1, &m_ppo);
		return NO_ERROR;
	}